

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractSyntaxTree.cpp
# Opt level: O0

void __thiscall MyCompiler::Expression::Expression(Expression *this)

{
  allocator local_31;
  string local_30 [32];
  Expression *local_10;
  Expression *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Expression",&local_31);
  AbstractAstNode::AbstractAstNode(&this->super_AbstractAstNode,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::shared_ptr<MyCompiler::AddSubOp>::shared_ptr(&this->pAddSubOp);
  std::shared_ptr<MyCompiler::Term>::shared_ptr(&this->pTerm);
  std::
  vector<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
  ::vector(&this->vAddSubOpExpression);
  return;
}

Assistant:

MyCompiler::Expression::Expression()
        : AbstractAstNode("Expression")
{}